

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

int resolveUpvalue(Compiler *compiler,Token *name)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  
  if (compiler->enclosing == (Compiler *)0x0) {
    return -1;
  }
  uVar1 = resolveLocal(compiler->enclosing,name);
  if (uVar1 == 0xffffffff) {
    uVar2 = resolveUpvalue(compiler->enclosing,name);
    if (uVar2 == 0xffffffff) {
      return -1;
    }
  }
  else {
    compiler->enclosing->locals[uVar1].isCaptured = true;
    uVar2 = uVar1;
  }
  iVar3 = addUpvalue(compiler,(uint8_t)uVar2,uVar1 != 0xffffffff);
  return iVar3;
}

Assistant:

static int resolveUpvalue(Compiler* compiler, Token* name) {
    if (compiler->enclosing == NULL) return -1;

    //Check if variable is in current Scope
    int local = resolveLocal(compiler->enclosing, name);
    if (local != -1) {
        compiler->enclosing->locals[local].isCaptured = true;
        return addUpvalue(compiler, (uint8_t)local, true);
    }

    //Check if variable is in current scope upValue
    int upvalue = resolveUpvalue(compiler->enclosing, name);
    if (upvalue != -1) {
        return addUpvalue(compiler, (uint8_t)upvalue, false);
    }

    return -1;
}